

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

maybe<rangeless::fn::impl::X> __thiscall
rangeless::fn::impl::to_seq::
gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::operator()
          (gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> *this)

{
  X *pXVar1;
  maybe<rangeless::fn::impl::X> in_RDI;
  
  if (this->started == false) {
    this->started = true;
    pXVar1 = (this->inps).
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pXVar1 = (this->it)._M_current;
    if (pXVar1 == (this->inps).
                  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00171f60;
    pXVar1 = pXVar1 + 1;
  }
  (this->it)._M_current = pXVar1;
LAB_00171f60:
  pXVar1 = (this->it)._M_current;
  if (pXVar1 != (this->inps).
                super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    *(int *)in_RDI = pXVar1->value;
    *(undefined1 *)((long)in_RDI + 4) = 0;
    return in_RDI;
  }
  *(undefined1 *)((long)in_RDI + 4) = 1;
  return in_RDI;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    started = true;
                    it = inps.begin(); 
                        // r might not be a container (i.e. some input-range
                        // and begin()  may be non-const, so deferring until
                        // the first call to operator() rather than
                        // initializing it{ r.begin() } in constructor.
                } else if(it == inps.end()) {
                    ; // may be equal to end in case of repeated calls to operator() after ended
                } else {
                    ++it;
                }

                if(it == inps.end()) {
                    return { };
                } else {
                    return { std::move(*it) };
                }
            }